

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_clock.cpp
# Opt level: O0

void AppendRenderTimes(FString *str)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double bsp;
  double clipwall;
  double setupwall;
  FString *str_local;
  
  dVar1 = glcycle_t::TimeMS(&SetupWall);
  dVar2 = glcycle_t::TimeMS(&ClipWall);
  dVar3 = glcycle_t::TimeMS(&SetupWall);
  glcycle_t::TimeMS(&Bsp);
  glcycle_t::TimeMS(&ClipWall);
  glcycle_t::TimeMS(&SetupFlat);
  glcycle_t::TimeMS(&SetupSprite);
  dVar4 = glcycle_t::TimeMS(&RenderWall);
  dVar5 = glcycle_t::TimeMS(&RenderFlat);
  dVar6 = glcycle_t::TimeMS(&SetupFlat);
  dVar7 = glcycle_t::TimeMS(&RenderSprite);
  dVar8 = glcycle_t::TimeMS(&SetupSprite);
  dVar9 = glcycle_t::TimeMS(&All);
  dVar10 = glcycle_t::TimeMS(&Finish);
  glcycle_t::TimeMS(&RenderAll);
  glcycle_t::TimeMS(&ProcessAll);
  glcycle_t::TimeMS(&PortalAll);
  glcycle_t::TimeMS(&drawcalls);
  glcycle_t::TimeMS(&Finish);
  FString::AppendFormat
            (str,
             "W: Render=%2.3f, Setup=%2.3f, Clip=%2.3f\nF: Render=%2.3f, Setup=%2.3f\nS: Render=%2.3f, Setup=%2.3f\nAll=%2.3f, Render=%2.3f, Setup=%2.3f, BSP = %2.3f, Portal=%2.3f, Drawcalls=%2.3f, Finish=%2.3f\n"
             ,dVar4,dVar1,dVar2 - dVar3,dVar5,dVar6,dVar7,dVar8,dVar9 + dVar10);
  return;
}

Assistant:

static void AppendRenderTimes(FString &str)
{
	double setupwall = SetupWall.TimeMS();
	double clipwall = ClipWall.TimeMS() - SetupWall.TimeMS();
	double bsp = Bsp.TimeMS() - ClipWall.TimeMS() - SetupFlat.TimeMS() - SetupSprite.TimeMS();

	str.AppendFormat("W: Render=%2.3f, Setup=%2.3f, Clip=%2.3f\n"
		"F: Render=%2.3f, Setup=%2.3f\n"
		"S: Render=%2.3f, Setup=%2.3f\n"
		"All=%2.3f, Render=%2.3f, Setup=%2.3f, BSP = %2.3f, Portal=%2.3f, Drawcalls=%2.3f, Finish=%2.3f\n",
	RenderWall.TimeMS(), setupwall, clipwall, RenderFlat.TimeMS(), SetupFlat.TimeMS(),
	RenderSprite.TimeMS(), SetupSprite.TimeMS(), All.TimeMS() + Finish.TimeMS(), RenderAll.TimeMS(),
	ProcessAll.TimeMS(), bsp, PortalAll.TimeMS(), drawcalls.TimeMS(), Finish.TimeMS());
}